

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void __thiscall
libcellml::flattenUnitsImports
          (libcellml *this,ModelPtr *flatModel,UnitsPtr *units,size_t index,ComponentPtr *component)

{
  int __flags;
  ModelPtr MVar2;
  UnitsPtr importedUnits;
  ModelPtr importingModelCopy;
  ImportSourcePtr importSource;
  string local_78;
  undefined1 local_58 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  ImportedEntity local_38;
  size_t sVar1;
  
  sVar1 = index;
  ImportedEntity::importSource(&local_38);
  __flags = (int)sVar1;
  MVar2 = ImportSource::model((ImportSource *)&local_78);
  Model::clone((Model *)(local_58 + 0x10),(__fn *)local_78._M_dataplus._M_p,
               MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi,__flags,component);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length);
  ImportedEntity::importReference_abi_cxx11_
            (&local_78,
             (ImportedEntity *)
             &((flatModel->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->super_enable_shared_from_this<libcellml::Model>);
  Model::units((Model *)local_58,(string *)local_58._16_8_);
  std::__cxx11::string::~string((string *)&local_78);
  NamedEntity::name_abi_cxx11_
            (&local_78,
             (NamedEntity *)
             (flatModel->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  NamedEntity::setName((NamedEntity *)local_58._0_8_,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  Model::replaceUnits(*(Model **)this,(size_t)units,(UnitsPtr *)local_58);
  retrieveUnitsDependencies
            ((ModelPtr *)this,(ModelPtr *)(local_58 + 0x10),(UnitsPtr *)local_58,
             (ComponentPtr *)index);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38.mPimpl);
  return;
}

Assistant:

void flattenUnitsImports(const ModelPtr &flatModel, const UnitsPtr &units, size_t index, const ComponentPtr &component)
{
    auto importSource = units->importSource();
    auto importingModelCopy = importSource->model()->clone();
    auto importedUnits = importingModelCopy->units(units->importReference());
    importedUnits->setName(units->name());
    flatModel->replaceUnits(index, importedUnits);
    retrieveUnitsDependencies(flatModel, importingModelCopy, importedUnits, component);
}